

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

AssertionExpr *
slang::ast::UnaryAssertionExpr::fromSyntax(UnaryPropertyExprSyntax *syntax,ASTContext *context)

{
  bool bVar1;
  int iVar2;
  PropertyExprSyntax *pPVar3;
  undefined4 extraout_var;
  UnaryAssertionExpr *pUVar4;
  long in_RDI;
  AssertionExpr *expr;
  Compilation *comp;
  bitmask<slang::ast::ASTFlags> extraFlags;
  UnaryAssertionOperator op;
  ASTContext *in_stack_ffffffffffffff88;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff90;
  nullopt_t *in_stack_ffffffffffffffa8;
  AssertionExpr *in_stack_ffffffffffffffb0;
  UnaryAssertionOperator *in_stack_ffffffffffffffb8;
  bitmask<slang::ast::ASTFlags> local_30;
  bitmask<slang::ast::ASTFlags> local_28;
  bitmask<slang::ast::ASTFlags> local_20;
  UnaryAssertionOperator local_14;
  
  local_14 = getUnaryOp(*(TokenKind *)(in_RDI + 0x18));
  bitmask<slang::ast::ASTFlags>::bitmask(&local_20);
  if (local_14 == NextTime) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_28,PropertyTimeAdvance);
    local_20.m_bits = local_28.m_bits;
  }
  else {
    bVar1 = isNegationOp(local_14);
    if (bVar1) {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_30,PropertyNegation);
      local_20.m_bits = local_30.m_bits;
    }
  }
  ASTContext::getCompilation((ASTContext *)0x9b1c39);
  pPVar3 = not_null<slang::syntax::PropertyExprSyntax_*>::operator*
                     ((not_null<slang::syntax::PropertyExprSyntax_*> *)0x9b1c4f);
  ASTContext::resetFlags(in_stack_ffffffffffffff88,in_stack_ffffffffffffff90);
  iVar2 = AssertionExpr::bind((int)pPVar3,(sockaddr *)&stack0xffffffffffffff88,0);
  pUVar4 = BumpAllocator::
           emplace<slang::ast::UnaryAssertionExpr,slang::ast::UnaryAssertionOperator&,slang::ast::AssertionExpr_const&,std::nullopt_t_const&>
                     ((BumpAllocator *)CONCAT44(extraout_var,iVar2),in_stack_ffffffffffffffb8,
                      in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  return &pUVar4->super_AssertionExpr;
}

Assistant:

AssertionExpr& UnaryAssertionExpr::fromSyntax(const UnaryPropertyExprSyntax& syntax,
                                              const ASTContext& context) {
    auto op = getUnaryOp(syntax.op.kind);

    bitmask<ASTFlags> extraFlags;
    if (op == UnaryAssertionOperator::NextTime)
        extraFlags = ASTFlags::PropertyTimeAdvance;
    else if (isNegationOp(op))
        extraFlags = ASTFlags::PropertyNegation;

    auto& comp = context.getCompilation();
    auto& expr = bind(*syntax.expr, context.resetFlags(extraFlags));
    return *comp.emplace<UnaryAssertionExpr>(op, expr, std::nullopt);
}